

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmHttpExtractHeaders(SyString *pRequest,SySet *pOut)

{
  char cVar1;
  char *pcVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  ulong uVar5;
  ushort **ppuVar6;
  SySet *pSVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  bool bVar16;
  sxu32 nPos;
  SyString sCurrent;
  int local_80;
  undefined8 local_78;
  uint local_70;
  byte *local_68;
  uint local_60;
  uint local_54;
  SySet *local_50;
  SyString *local_48;
  SyString local_40;
  
  local_50 = pOut;
  local_48 = pRequest;
  if (pOut->nUsed == 0) {
    lVar15 = 0;
  }
  else {
    lVar15 = (ulong)((pOut->nUsed - 1) * pOut->eSize) + (long)pOut->pBase;
  }
LAB_00121d19:
  uVar5 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&local_78 + uVar5 + 4) = 0;
    uVar5 = uVar5 + 4;
  } while (uVar5 < 0x1c);
  sVar3 = VmGetNextLine(pRequest,&local_40);
  uVar10 = local_40.nByte;
  pcVar2 = local_40.zString;
  uVar8 = CONCAT31((int3)((uint)sVar3 >> 8),sVar3 != 0);
  if (sVar3 != 0 && local_40.nByte == 0) {
    return uVar8;
  }
  pSVar7 = (SySet *)(ulong)uVar8;
  if (local_40.nByte != 0) {
    if ((lVar15 == 0) ||
       ((cVar1 = *(char *)((long)&((SySet *)((long)local_40.zString + -0x28))->pUserData + 7),
        cVar1 != ' ' && (cVar1 != '\t')))) {
      uVar11 = SyByteFind(local_40.zString,local_40.nByte,0x3a,&local_54);
      uVar8 = local_54;
      pSVar7 = (SySet *)(ulong)uVar11;
      if (uVar11 == 0) {
        local_78 = (SySet *)pcVar2;
        local_70 = local_54;
        if (local_54 != 0) {
          bVar12 = *(byte *)(SyMemBackend **)pcVar2;
          pSVar7 = (SySet *)pcVar2;
          if (bVar12 < 0xc0) {
            ppuVar6 = __ctype_b_loc();
            local_78 = (SySet *)((long)(SyMemBackend **)pcVar2 + (ulong)(uVar8 - 1) + 1);
            local_70 = uVar8;
            do {
              if ((*(byte *)((long)*ppuVar6 + (long)(char)bVar12 * 2 + 1) & 0x20) == 0) break;
              if (local_70 == 1) {
                local_70 = 0;
                goto LAB_00121efe;
              }
              bVar12 = *(byte *)((long)&pSVar7->pAllocator + 1);
              pSVar7 = (SySet *)((long)&pSVar7->pAllocator + 1);
              local_70 = local_70 - 1;
            } while (bVar12 < 0xc0);
          }
          local_78 = pSVar7;
          uVar11 = local_70 - 1;
          do {
            uVar5 = (ulong)*(char *)((long)&pSVar7->pAllocator + (ulong)uVar11);
            if ((0xffffffffffffffbf < uVar5) ||
               (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + uVar5 * 2 + 1) & 0x20) == 0))
            break;
            uVar13 = uVar11 - 1;
            local_70 = uVar11;
            uVar11 = uVar13;
          } while (uVar13 != 0xffffffff);
        }
LAB_00121efe:
        pbVar9 = (byte *)((long)(SyMemBackend **)pcVar2 + (ulong)(uVar8 + 1));
        uVar10 = uVar10 + ~uVar8;
        local_68 = pbVar9;
        local_60 = uVar10;
        if (uVar10 != 0) {
          bVar12 = *pbVar9;
          if (bVar12 < 0xc0) {
            ppuVar6 = __ctype_b_loc();
            local_68 = (byte *)((long)(SyMemBackend **)pcVar2 + (ulong)(uVar8 + 1) + 1);
            do {
              if ((*(byte *)((long)*ppuVar6 + (long)(char)bVar12 * 2 + 1) & 0x20) == 0) break;
              if (uVar10 == 1) {
                local_60 = 0;
                goto LAB_00121fac;
              }
              bVar12 = *local_68;
              local_68 = local_68 + 1;
              uVar10 = uVar10 - 1;
            } while (bVar12 < 0xc0);
            pbVar9 = local_68 + -1;
          }
          local_68 = pbVar9;
          local_60 = uVar10;
          uVar8 = uVar10 - 1;
          do {
            bVar12 = pbVar9[uVar8];
            if ((0xffffffffffffffbf < (ulong)(long)(char)bVar12) ||
               (ppuVar6 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar6 + (long)(char)bVar12 * 2 + 1) & 0x20) == 0)) break;
            uVar10 = uVar8 - 1;
            local_60 = uVar8;
            uVar8 = uVar10;
          } while (uVar10 != 0xffffffff);
        }
LAB_00121fac:
        sVar4 = SySetPut(local_50,&local_78);
        if (sVar4 != 0) {
          return sVar4;
        }
        pSVar7 = local_50;
        pRequest = local_48;
        if (local_50->nUsed == 0) {
          lVar15 = 0;
        }
        else {
          lVar15 = (ulong)((local_50->nUsed - 1) * local_50->eSize) + (long)local_50->pBase;
        }
      }
      goto LAB_00121fed;
    }
    uVar8 = *(uint *)(lVar15 + 0x18);
    if (uVar8 != 0) {
      pcVar14 = *(char **)(lVar15 + 0x10);
      local_80 = (int)local_40.zString;
      uVar11 = (local_40.nByte + local_80) - (int)pcVar14;
      do {
        uVar8 = uVar8 - 1;
        cVar1 = *pcVar14;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) goto LAB_00121dd2;
        *(uint *)(lVar15 + 0x18) = uVar8;
        pcVar14 = pcVar14 + 1;
        *(char **)(lVar15 + 0x10) = pcVar14;
        uVar11 = uVar11 - 1;
      } while (uVar8 != 0);
    }
    goto LAB_00121dff;
  }
  goto LAB_00121fed;
  while( true ) {
    ppuVar6 = __ctype_b_loc();
    pSVar7 = (SySet *)*ppuVar6;
    if ((*(byte *)((long)&pSVar7->pAllocator + (long)cVar1 * 2 + 1) & 0x20) == 0) goto LAB_00121ed9;
    *(uint *)(lVar15 + 0x18) = uVar8;
    bVar16 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar16) break;
LAB_00121dd2:
    pSVar7 = (SySet *)(ulong)uVar8;
    cVar1 = pcVar14[(long)pSVar7];
    if (0xffffffffffffffbf < (ulong)(long)cVar1) goto LAB_00121ed9;
  }
LAB_00121dff:
  *(char **)(lVar15 + 0x10) = pcVar2;
  pSVar7 = (SySet *)pcVar2;
  uVar11 = uVar10;
LAB_00121ed9:
  *(uint *)(lVar15 + 0x18) = uVar11;
  pRequest = local_48;
LAB_00121fed:
  if (sVar3 != 0) {
    return (sxi32)pSVar7;
  }
  goto LAB_00121d19;
}

Assistant:

static sxi32 VmHttpExtractHeaders(SyString *pRequest, SySet *pOut)
 {
	 SyhttpHeader *pLast = 0;
	 SyString sCurrent;
	 SyhttpHeader sHdr;
	 sxu8 bEol;
	 sxi32 rc;
	 if( SySetUsed(pOut) > 0 ){
		 pLast = (SyhttpHeader *)SySetAt(pOut, SySetUsed(pOut)-1);
	 }
	 bEol = FALSE;
	 for(;;){
		 SyZero(&sHdr, sizeof(SyhttpHeader));
		 /* Extract a single line from the raw HTTP request */
		 rc = VmGetNextLine(pRequest, &sCurrent);
		 if(rc != SXRET_OK ){
			 if( sCurrent.nByte < 1 ){
				 break;
			 }
			 bEol = TRUE;
		 }
		 /* Process the header */
		 if( SXRET_OK == VmHttpProcessOneHeader(&sHdr, pLast, sCurrent.zString, sCurrent.nByte)){
			 if( SXRET_OK != SySetPut(pOut, (const void *)&sHdr) ){
				 break;
			 }
			 /* Retrieve the last parsed header so we can handle multi-line header
			  * in case we face one of them.
			  */
			 pLast = (SyhttpHeader *)SySetPeek(pOut);
		 }
		 if( bEol ){
			 break;
		 }
	 } /* for(;;) */
	 return SXRET_OK;
 }